

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::train_single_example<true>
               (search *sch,bool is_test_ex,bool is_holdout_ex,multi_ex *ec_seq)

{
  undefined4 uVar1;
  uint uVar2;
  string *psVar3;
  code *pcVar4;
  value_type peVar5;
  shared_data *psVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined *puVar11;
  ulong uVar12;
  bool bVar13;
  int **ppiVar14;
  reference ppeVar15;
  size_t sVar16;
  label *plVar17;
  v_array<Search::action_cache> **ppvVar18;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar19;
  unsigned_long *puVar20;
  uint *puVar21;
  wclass *pwVar22;
  wclass **ppwVar23;
  example *peVar24;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  byte in_DL;
  byte in_SIL;
  long *in_RDI;
  size_t this_num;
  size_t prev_num;
  size_t n;
  wclass *wc;
  wclass *__end3_1;
  wclass *__begin3_1;
  v_array<COST_SENSITIVE::wclass> *__range3_1;
  size_t i_1;
  float this_loss;
  bool skipped_all_actions;
  size_t tid;
  size_t i;
  int sink;
  int *__end3;
  int *__begin3;
  v_array<int> *__range3;
  bool ran_test;
  vw *all;
  search_private *priv;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  float in_stack_fffffffffffffd70;
  uint32_t in_stack_fffffffffffffd74;
  polylabel *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  search_private *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *in_stack_fffffffffffffdc8;
  label *losses;
  long local_218;
  v_array<unsigned_long> *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  bool local_1b9;
  string local_1b8 [32];
  ulong local_198;
  ulong local_190;
  ulong local_188;
  wclass *local_180;
  wclass *local_178;
  wclass *local_170;
  v_array<COST_SENSITIVE::wclass> *local_168;
  ulong local_160;
  undefined4 local_158;
  byte local_151;
  label *local_150;
  ulong local_148;
  allocator local_139;
  string local_138 [32];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff13;
  float in_stack_ffffffffffffff14;
  polylabel *in_stack_ffffffffffffff18;
  search_private *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  vw *in_stack_ffffffffffffff30;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  float fStack_b0;
  uint32_t uStack_ac;
  string local_a8 [36];
  int local_84;
  int *local_80;
  int *local_78;
  v_array<int> *local_70;
  allocator local_51;
  string local_50 [39];
  byte local_29;
  undefined8 *local_28;
  long *local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  byte local_a;
  byte local_9;
  long *local_8;
  float multiplier;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_20 = (long *)*in_RDI;
  local_28 = (undefined8 *)*local_20;
  local_29 = 0;
  local_18 = in_RCX;
  local_8 = in_RDI;
  clear_cache_hash_map((search_private *)0x455bda);
  bVar13 = must_run_test((vw *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (multi_ex *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         false);
  if (bVar13) {
    local_29 = 1;
    reset_search_structure(in_stack_fffffffffffffdb0);
    *(undefined4 *)((long)local_20 + 0x6c) = 1;
    bVar13 = might_print_update((vw *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60))
    ;
    local_1b9 = true;
    if (!bVar13) {
      sVar16 = v_array<int>::size((v_array<int> *)(local_28 + 0x6a2));
      local_1b9 = true;
      if (sVar16 == 0) {
        local_1b9 = 0 < *(int *)(local_28 + 0x6a6);
      }
    }
    *(bool *)((long)local_20 + 0x271) = local_1b9;
    psVar3 = (string *)local_20[0x4f];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"",&local_51);
    std::__cxx11::stringstream::str(psVar3);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x455d2b);
    run_task((search *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (multi_ex *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    if ((local_9 & 1) == 0) {
      psVar6 = (shared_data *)*local_28;
      ppeVar15 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      shared_data::update(psVar6,(bool)((*ppeVar15)->test_only & 1),(bool)((local_9 ^ 0xff) & 1),
                          *(float *)((long)local_20 + 0x244),1.0,local_20[0x57]);
    }
    local_70 = (v_array<int> *)(local_28 + 0x6a2);
    ppiVar14 = v_array<int>::begin(local_70);
    local_78 = *ppiVar14;
    ppiVar14 = v_array<int>::end(local_70);
    local_80 = *ppiVar14;
    for (; local_78 != local_80; local_78 = local_78 + 1) {
      in_stack_fffffffffffffe14 = *local_78;
      pcVar4 = (code *)local_28[0x6a8];
      local_84 = in_stack_fffffffffffffe14;
      std::__cxx11::stringstream::str();
      ppeVar15 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      peVar5 = *ppeVar15;
      pcVar7 = (peVar5->tag)._begin;
      pcVar8 = (peVar5->tag)._end;
      pcVar9 = (peVar5->tag).end_array;
      sVar16 = (peVar5->tag).erase_count;
      local_c8 = SUB84(pcVar7,0);
      uStack_c4 = (undefined4)((ulong)pcVar7 >> 0x20);
      uStack_c0 = SUB84(pcVar8,0);
      uStack_bc = (undefined4)((ulong)pcVar8 >> 0x20);
      local_b8 = SUB84(pcVar9,0);
      uStack_b4 = (undefined4)((ulong)pcVar9 >> 0x20);
      fStack_b0 = (float)sVar16;
      uStack_ac = (uint32_t)(sVar16 >> 0x20);
      (*pcVar4)(in_stack_fffffffffffffe14,local_a8);
      std::__cxx11::string::~string(local_a8);
      in_stack_fffffffffffffd58 = local_c8;
      in_stack_fffffffffffffd5c = uStack_c4;
      in_stack_fffffffffffffd60 = uStack_c0;
      in_stack_fffffffffffffd64 = uStack_bc;
      in_stack_fffffffffffffd68 = local_b8;
      in_stack_fffffffffffffd6c = uStack_b4;
      in_stack_fffffffffffffd70 = fStack_b0;
      in_stack_fffffffffffffd74 = uStack_ac;
    }
    if (0 < *(int *)(local_28 + 0x6a6)) {
      pcVar4 = (code *)local_28[0x6a8];
      uVar1 = *(undefined4 *)(local_28 + 0x6a6);
      in_stack_fffffffffffffe08 = (v_array<unsigned_long> *)&stack0xffffffffffffff17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff18,"",(allocator *)in_stack_fffffffffffffe08);
      ppeVar15 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      peVar5 = *ppeVar15;
      pcVar7 = (peVar5->tag)._begin;
      pcVar8 = (peVar5->tag)._end;
      pcVar9 = (peVar5->tag).end_array;
      sVar16 = (peVar5->tag).erase_count;
      local_118._0_4_ = SUB84(pcVar7,0);
      local_118._4_4_ = (undefined4)((ulong)pcVar7 >> 0x20);
      uStack_110._0_4_ = SUB84(pcVar8,0);
      uStack_110._4_4_ = (undefined4)((ulong)pcVar8 >> 0x20);
      local_108._0_4_ = SUB84(pcVar9,0);
      local_108._4_4_ = (undefined4)((ulong)pcVar9 >> 0x20);
      uStack_100._0_4_ = (float)sVar16;
      uStack_100._4_4_ = (uint32_t)(sVar16 >> 0x20);
      in_stack_fffffffffffffd58 = (undefined4)local_118;
      in_stack_fffffffffffffd5c = local_118._4_4_;
      in_stack_fffffffffffffd60 = (undefined4)uStack_110;
      in_stack_fffffffffffffd64 = uStack_110._4_4_;
      in_stack_fffffffffffffd68 = (undefined4)local_108;
      in_stack_fffffffffffffd6c = local_108._4_4_;
      in_stack_fffffffffffffd70 = (float)uStack_100;
      in_stack_fffffffffffffd74 = uStack_100._4_4_;
      local_118 = pcVar7;
      uStack_110 = pcVar8;
      local_108 = pcVar9;
      uStack_100 = sVar16;
      (*pcVar4)(uVar1,&stack0xffffffffffffff18);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    }
  }
  if (((((local_9 & 1) == 0) && ((local_a & 1) == 0)) &&
      (ppeVar15 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0),
      ((*ppeVar15)->test_only & 1U) == 0)) && ((*(byte *)(*local_20 + 0x343a) & 1) != 0)) {
    clear_cache_hash_map((search_private *)0x45610f);
    reset_search_structure(in_stack_fffffffffffffdb0);
    clear_memo_foreach_action
              ((search_private *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    *(undefined4 *)((long)local_20 + 0x6c) = 2;
    v_array<std::pair<float,_unsigned_long>_>::clear
              ((v_array<std::pair<float,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    v_array<Search::scored_action>::clear
              ((v_array<Search::scored_action> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    run_task((search *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (multi_ex *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    if ((local_29 & 1) == 0) {
      psVar6 = (shared_data *)*local_28;
      ppeVar15 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      shared_data::update(psVar6,(bool)((*ppeVar15)->test_only & 1),true,
                          *(float *)((long)local_20 + 0x244),1.0,local_20[0x57]);
    }
    if (((local_20[0x41] != 0) && (local_20[0x13] + local_20[0xcc] != 0)) &&
       ((int)local_20[0x53] != 4)) {
      if (local_20[0xca] == 0) {
        local_218 = local_20[0x13];
      }
      else {
        local_218 = local_20[0xcc];
      }
      local_20[0x14] = local_218;
      get_training_timesteps
                ((search_private *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"",&local_139);
      cdbg_print_array<Search::scored_action>
                ((string *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (v_array<Search::scored_action> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      for (local_148 = 0; uVar12 = local_148,
          sVar16 = v_array<v_array<Search::action_cache>_*>::size
                             ((v_array<v_array<Search::action_cache>_*> *)(local_20 + 0xcd)),
          uVar12 < sVar16; local_148 = local_148 + 1) {
        v_array<v_array<Search::action_cache>_*>::operator[]
                  ((v_array<v_array<Search::action_cache>_*> *)(local_20 + 0xcd),local_148);
      }
      if ((*(byte *)(local_20 + 0xd) & 1) == 0) {
        v_array<COST_SENSITIVE::wclass>::clear
                  ((v_array<COST_SENSITIVE::wclass> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      }
      else {
        v_array<CB::cb_class>::clear
                  ((v_array<CB::cb_class> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      }
      local_150 = (label *)0x0;
      while (losses = local_150,
            plVar17 = (label *)v_array<unsigned_long>::size
                                         ((v_array<unsigned_long> *)(local_20 + 0xac)),
            losses < plVar17) {
        if ((local_20[0xca] == 0) ||
           (ppvVar18 = v_array<v_array<Search::action_cache>_*>::operator[]
                                 ((v_array<v_array<Search::action_cache>_*> *)(local_20 + 0xcd),
                                  (size_t)local_150),
           *ppvVar18 != (v_array<Search::action_cache> *)0x0)) {
          local_20[0x19] = 0;
          local_20[0x1a] = 0;
          reset_search_structure(in_stack_fffffffffffffdb0);
          local_151 = 1;
          local_20[0x47] = 0;
          *(undefined1 *)(local_20 + 0x48) = 0;
          while (((*(byte *)(local_20 + 0x48) ^ 0xff) & 1) != 0) {
            puVar20 = v_array<unsigned_long>::operator[]
                                ((v_array<unsigned_long> *)(local_20 + 0xac),(size_t)local_150);
            local_20[0x46] = *puVar20;
            advance_from_known_actions
                      ((search_private *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
            if ((*(byte *)(local_20 + 0x48) & 1) != 0) break;
            local_151 = 0;
            reset_search_structure(in_stack_fffffffffffffdb0);
            *(undefined4 *)((long)local_20 + 0x6c) = 3;
            puVar20 = v_array<unsigned_long>::operator[]
                                ((v_array<unsigned_long> *)(local_20 + 0xac),(size_t)local_150);
            local_20[0x46] = *puVar20;
            run_task((search *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (multi_ex *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
            local_158 = (undefined4)local_20[0x49];
            in_stack_fffffffffffffdc4 =
                 CONCAT13((char)local_20[0xd],(int3)in_stack_fffffffffffffdc4);
            in_stack_fffffffffffffdc8 =
                 (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)(local_20 + 0xb0);
            if ((*(byte *)((long)local_20 + 0x13) & 1) == 0) {
              in_stack_fffffffffffffdc0 = (int)local_20[0x47];
            }
            else {
              in_stack_fffffffffffffdc0 = (int)local_20[0x47] + -1;
            }
            cs_cost_push_back(SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0),
                              in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                              in_stack_fffffffffffffd70);
          }
          if (0.0 < *(float *)((long)local_20 + 0x614)) {
            in_stack_fffffffffffffdb0 = (search_private *)(local_20 + 0xb0);
            pvVar19 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                                ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                                 (local_20 + 0xbe),local_20[0x46]);
            multiplier = (float)((ulong)pvVar19 >> 0x20);
            std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
            verify_active_csoaa(losses,in_stack_fffffffffffffdc8,
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                multiplier);
          }
          if ((local_151 & 1) != 0) {
            reset_search_structure(in_stack_fffffffffffffdb0);
            *(undefined4 *)((long)local_20 + 0x6c) = 3;
            puVar20 = v_array<unsigned_long>::operator[]
                                ((v_array<unsigned_long> *)(local_20 + 0xac),(size_t)local_150);
            local_20[0x46] = *puVar20;
            *(undefined1 *)(local_20 + 0xc2) = 1;
            run_task((search *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (multi_ex *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          }
          sVar16 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(local_20 + 0x27));
          if (sVar16 != 0) {
            for (local_160 = 0; uVar12 = local_160,
                sVar16 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(local_20 + 0x27)),
                uVar12 < sVar16; local_160 = local_160 + 1) {
              puVar21 = v_array<unsigned_int>::operator[]
                                  ((v_array<unsigned_int> *)(local_20 + 0x27),local_160);
              uVar2 = *puVar21;
              pwVar22 = v_array<COST_SENSITIVE::wclass>::operator[]
                                  ((v_array<COST_SENSITIVE::wclass> *)(local_20 + 0xb0),local_160);
              pwVar22->class_index = uVar2;
            }
          }
          local_168 = (v_array<COST_SENSITIVE::wclass> *)(local_20 + 0xb0);
          ppwVar23 = v_array<COST_SENSITIVE::wclass>::begin(local_168);
          local_170 = *ppwVar23;
          ppwVar23 = v_array<COST_SENSITIVE::wclass>::end(local_168);
          local_178 = *ppwVar23;
          for (; local_170 != local_178; local_170 = local_170 + 1) {
            local_180 = local_170;
          }
          generate_training_example
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                     (bool)in_stack_ffffffffffffff13,in_stack_ffffffffffffff0c);
          if ((*(byte *)((long)local_20 + 0x12) & 1) == 0) {
            for (local_188 = 0; uVar12 = local_188,
                sVar16 = v_array<example>::size((v_array<example> *)(local_20 + 0x15)),
                puVar11 = PTR_delete_label_00522610, uVar10 = MULTICLASS::mc_label._32_8_,
                uVar12 < sVar16; local_188 = local_188 + 1) {
              if ((*(byte *)(*local_8 + 0x13) & 1) == 0) {
                peVar24 = v_array<example>::operator[]
                                    ((v_array<example> *)(local_20 + 0x15),local_188);
                (*(code *)uVar10)(&peVar24->l);
              }
              else {
                peVar24 = v_array<example>::operator[]
                                    ((v_array<example> *)(local_20 + 0x15),local_188);
                (*(code *)puVar11)(&peVar24->l);
              }
            }
          }
          if ((*(byte *)(local_20 + 0xd) & 1) == 0) {
            v_array<COST_SENSITIVE::wclass>::clear
                      ((v_array<COST_SENSITIVE::wclass> *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          }
          else {
            v_array<CB::cb_class>::clear
                      ((v_array<CB::cb_class> *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          }
        }
        local_150 = (label *)((long)&(local_150->costs)._begin + 1);
      }
      if (((*(byte *)((long)local_20 + 0x611) & 1) != 0) && (1 < (ulong)local_20[0x4d])) {
        local_190 = (ulong)local_20[0x4c] / (ulong)local_20[0x4d];
        local_198 = (ulong)local_20[0x4b] / (ulong)local_20[0x4d];
        if (local_190 < local_198) {
          std::__cxx11::string::string(local_1b8,(string *)(local_28 + 0x6ae));
          save_predictor(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         (size_t)in_stack_ffffffffffffff20);
          std::__cxx11::string::~string(local_1b8);
        }
        local_20[0x4c] = local_20[0x4b];
      }
    }
  }
  return;
}

Assistant:

void train_single_example(search& sch, bool is_test_ex, bool is_holdout_ex, multi_ex& ec_seq)
{
  search_private& priv = *sch.priv;
  vw& all = *priv.all;
  bool ran_test = false;  // we must keep track so that even if we skip test, we still update # of examples seen

  // if (! priv.no_caching)
  clear_cache_hash_map(priv);

  cdbg << "is_test_ex=" << is_test_ex << " vw_is_main=" << all.vw_is_main << endl;
  cdbg << "must_run_test = " << must_run_test(all, ec_seq, is_test_ex) << endl;
  // do an initial test pass to compute output (and loss)
  if (must_run_test(all, ec_seq, is_test_ex))
  {
    cdbg << "======================================== INIT TEST (" << priv.current_policy << ","
         << priv.read_example_last_pass << ") ========================================" << endl;

    ran_test = true;

    // do the prediction
    reset_search_structure(priv);
    priv.state = INIT_TEST;
    priv.should_produce_string =
        might_print_update(all) || (all.final_prediction_sink.size() > 0) || (all.raw_prediction > 0);
    priv.pred_string->str("");
    priv.test_action_sequence.clear();
    run_task(sch, ec_seq);

    // accumulate loss
    if (!is_test_ex)
      all.sd->update(ec_seq[0]->test_only, !is_test_ex, priv.test_loss, 1.f, priv.num_features);

    // generate output
    for (int sink : all.final_prediction_sink) all.print_text((int)sink, priv.pred_string->str(), ec_seq[0]->tag);

    if (all.raw_prediction > 0)
      all.print_text(all.raw_prediction, "", ec_seq[0]->tag);
  }

  // if we're not training, then we're done!
  if ((!is_learn) || is_test_ex || is_holdout_ex || ec_seq[0]->test_only || (!priv.all->training))
    return;

  // SPEEDUP: if the oracle was never called, we can skip this!

  // do a pass over the data allowing oracle
  cdbg << "======================================== INIT TRAIN (" << priv.current_policy << ","
       << priv.read_example_last_pass << ") ========================================" << endl;
  // cerr << "training" << endl;

  clear_cache_hash_map(priv);
  reset_search_structure(priv);
  clear_memo_foreach_action(priv);
  priv.state = INIT_TRAIN;
  priv.active_uncertainty.clear();
  priv.train_trajectory.clear();  // this is where we'll store the training sequence
  run_task(sch, ec_seq);

  if (!ran_test)  // was  && !priv.ec_seq[0]->test_only) { but we know it's not test_only
    all.sd->update(ec_seq[0]->test_only, true, priv.test_loss, 1.f, priv.num_features);

  // if there's nothing to train on, we're done!
  if ((priv.loss_declared_cnt == 0) || (priv.t + priv.meta_t == 0) ||
      (priv.rollout_method == NO_ROLLOUT))  // TODO: make sure NO_ROLLOUT works with beam!
  {
    return;
  }

  // otherwise, we have some learn'in to do!
  cdbg << "======================================== LEARN (" << priv.current_policy << ","
       << priv.read_example_last_pass << ") ========================================" << endl;
  priv.T = priv.metatask ? priv.meta_t : priv.t;
  get_training_timesteps(priv, priv.timesteps);
  cdbg << "train_trajectory.size() = " << priv.train_trajectory.size() << ":\t";
  cdbg_print_array<scored_action>("", priv.train_trajectory);
  // cdbg << "memo_foreach_action = " << priv.memo_foreach_action << endl;
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
  {
    cdbg << "memo_foreach_action[" << i << "] = ";
    if (priv.memo_foreach_action[i])
      cdbg << *priv.memo_foreach_action[i];
    else
      cdbg << "null";
    cdbg << endl;
  }

  if (priv.cb_learner)
    priv.learn_losses.cb.costs.clear();
  else
    priv.learn_losses.cs.costs.clear();

  for (size_t tid = 0; tid < priv.timesteps.size(); tid++)
  {
    cdbg << "timestep = " << priv.timesteps[tid] << " [" << tid << "/" << priv.timesteps.size() << "]" << endl;

    if (priv.metatask && !priv.memo_foreach_action[tid])
    {
      cdbg << "skipping because it looks like this was overridden by metatask" << endl;
      continue;
    }

    priv.learn_ec_ref = nullptr;
    priv.learn_ec_ref_cnt = 0;

    reset_search_structure(priv);  // TODO remove this?
    bool skipped_all_actions = true;
    priv.learn_a_idx = 0;
    priv.done_with_all_actions = false;
    // for each action, roll out to get a loss
    while (!priv.done_with_all_actions)
    {
      priv.learn_t = priv.timesteps[tid];
      advance_from_known_actions(priv);
      if (priv.done_with_all_actions)
        break;

      skipped_all_actions = false;
      reset_search_structure(priv);

      priv.state = LEARN;
      priv.learn_t = priv.timesteps[tid];
      cdbg << "-------------------------------------------------------------------------------------" << endl;
      cdbg << "learn_t = " << priv.learn_t << ", learn_a_idx = " << priv.learn_a_idx << endl;
      // cdbg_print_array("priv.active_known[learn_t]", priv.active_known[priv.learn_t]);
      run_task(sch, ec_seq);
      // cerr_print_array("in GENER, learn_allowed_actions", priv.learn_allowed_actions);
      float this_loss = priv.learn_loss;
      cs_cost_push_back(priv.cb_learner, priv.learn_losses,
          priv.is_ldf ? (uint32_t)(priv.learn_a_idx - 1) : (uint32_t)priv.learn_a_idx, this_loss);
      //                          (priv.learn_allowed_actions.size() > 0) ?
      //                          priv.learn_allowed_actions[priv.learn_a_idx-1] : priv.is_ldf ? (priv.learn_a_idx-1) :
      //                          (priv.learn_a_idx),
      //                           priv.learn_loss);
    }
    if (priv.active_csoaa_verify > 0.)
      verify_active_csoaa(
          priv.learn_losses.cs, priv.active_known[priv.learn_t], ec_seq[0]->example_counter, priv.active_csoaa_verify);

    if (skipped_all_actions)
    {
      reset_search_structure(priv);
      priv.state = LEARN;
      priv.learn_t = priv.timesteps[tid];
      priv.force_setup_ec_ref = true;
      cdbg << "<<<<<" << endl;
      cdbg << "skipped all actions; learn_t = " << priv.learn_t << ", learn_a_idx = " << priv.learn_a_idx << endl;
      run_task(sch, ec_seq);  // TODO: i guess we can break out of this early
      cdbg << ">>>>>" << endl;
    }
    else
      cdbg << "didn't skip all actions" << endl;

    // now we can make a training example
    if (priv.learn_allowed_actions.size() > 0)
    {
      for (size_t i = 0; i < priv.learn_allowed_actions.size(); i++)
      {
        priv.learn_losses.cs.costs[i].class_index = priv.learn_allowed_actions[i];
      }
    }
    // float min_loss = 0.;
    // if (priv.metatask)
    //  for (size_t aid=0; aid<priv.memo_foreach_action[tid]->size(); aid++)
    //    min_loss = MIN(min_loss, priv.memo_foreach_action[tid]->get(aid).cost);
    cdbg << "priv.learn_losses = [";
    for (auto& wc : priv.learn_losses.cs.costs) cdbg << " " << wc.class_index << ":" << wc.x;
    cdbg << " ]" << endl;
    cdbg << "gte" << endl;
    generate_training_example(priv, priv.learn_losses, 1., true);  // , min_loss);  // TODO: weight
    if (!priv.examples_dont_change)
      for (size_t n = 0; n < priv.learn_ec_copy.size(); n++)
      {
        if (sch.priv->is_ldf)
          CS::cs_label.delete_label(&priv.learn_ec_copy[n].l.cs);
        else
          MC::mc_label.delete_label(&priv.learn_ec_copy[n].l.multi);
      }
    if (priv.cb_learner)
      priv.learn_losses.cb.costs.clear();
    else
      priv.learn_losses.cs.costs.clear();
  }

  if (priv.active_csoaa && (priv.save_every_k_runs > 1))
  {
    size_t prev_num = priv.num_calls_to_run_previous / priv.save_every_k_runs;
    size_t this_num = priv.num_calls_to_run / priv.save_every_k_runs;
    if (this_num > prev_num)
      save_predictor(all, all.final_regressor_name, this_num);
    priv.num_calls_to_run_previous = priv.num_calls_to_run;
  }
}